

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslOpMap.cpp
# Opt level: O0

TOperator glslang::HlslOpMap::binary(EHlslTokenClass op)

{
  TOperator local_c;
  EHlslTokenClass op_local;
  
  switch(op) {
  case EHTokLeftOp:
    local_c = EOpLeftShift;
    break;
  case EHTokRightOp:
    local_c = EOpRightShift;
    break;
  default:
    local_c = EOpNull;
    break;
  case EHTokLeOp:
    local_c = EOpLessThanEqual;
    break;
  case EHTokGeOp:
    local_c = EOpGreaterThanEqual;
    break;
  case EHTokEqOp:
    local_c = EOpEqual;
    break;
  case EHTokNeOp:
    local_c = EOpNotEqual;
    break;
  case EHTokAndOp:
    local_c = EOpLogicalAnd;
    break;
  case EHTokOrOp:
    local_c = EOpLogicalOr;
    break;
  case EHTokXorOp:
    local_c = EOpLogicalXor;
    break;
  case EHTokDash:
    local_c = EOpSub;
    break;
  case EHTokPlus:
    local_c = EOpAdd;
    break;
  case EHTokStar:
    local_c = EOpMul;
    break;
  case EHTokSlash:
    local_c = EOpDiv;
    break;
  case EHTokPercent:
    local_c = EOpMod;
    break;
  case EHTokLeftAngle:
    local_c = EOpLessThan;
    break;
  case EHTokRightAngle:
    local_c = EOpGreaterThan;
    break;
  case EHTokVerticalBar:
    local_c = EOpInclusiveOr;
    break;
  case EHTokCaret:
    local_c = EOpExclusiveOr;
    break;
  case EHTokAmpersand:
    local_c = EOpAnd;
  }
  return local_c;
}

Assistant:

TOperator HlslOpMap::binary(EHlslTokenClass op)
{
    switch (op) {
    case EHTokPlus:        return EOpAdd;
    case EHTokDash:        return EOpSub;
    case EHTokStar:        return EOpMul;
    case EHTokSlash:       return EOpDiv;
    case EHTokPercent:     return EOpMod;
    case EHTokRightOp:     return EOpRightShift;
    case EHTokLeftOp:      return EOpLeftShift;
    case EHTokAmpersand:   return EOpAnd;
    case EHTokVerticalBar: return EOpInclusiveOr;
    case EHTokCaret:       return EOpExclusiveOr;
    case EHTokEqOp:        return EOpEqual;
    case EHTokNeOp:        return EOpNotEqual;
    case EHTokLeftAngle:   return EOpLessThan;
    case EHTokRightAngle:  return EOpGreaterThan;
    case EHTokLeOp:        return EOpLessThanEqual;
    case EHTokGeOp:        return EOpGreaterThanEqual;
    case EHTokOrOp:        return EOpLogicalOr;
    case EHTokXorOp:       return EOpLogicalXor;
    case EHTokAndOp:       return EOpLogicalAnd;

    default:
        return EOpNull;
    }
}